

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

BufferOrError * __thiscall
slang::SourceManager::openCached
          (BufferOrError *__return_storage_ptr__,SourceManager *this,path *fullPath,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey)

{
  flat_hash_map<std::string,_std::pair<std::unique_ptr<FileData>,_std::error_code>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  error_category *peVar7;
  uint uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  _Alloc_hider __s1;
  size_type sVar13;
  _List _Var14;
  undefined8 uVar15;
  int iVar16;
  uint64_t uVar17;
  uint uVar18;
  uint uVar19;
  SourceManager *pSVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  value_type_pointer ppVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  error_code eVar29;
  unique_lock<std::shared_mutex> *in_stack_fffffffffffffe48;
  try_emplace_args_t local_199;
  uint64_t local_198;
  BufferOrError *local_190;
  SourceLibrary *local_188;
  SourceManager *local_180;
  error_category *local_178;
  string pathStr;
  value_type *elements;
  unique_lock<std::shared_mutex> lock;
  SourceLibrary *local_f8;
  undefined8 uStack_f0;
  unique_lock<std::shared_mutex> lock_1;
  path absPath;
  pair<std::nullptr_t,_std::error_code> local_88;
  SmallVector<char,_40UL> buffer;
  
  std::filesystem::__cxx11::path::path(&absPath);
  if (this->disableProximatePaths == false) {
    pathStr._M_dataplus._M_p = (pointer)((ulong)pathStr._M_dataplus._M_p._4_4_ << 0x20);
    pathStr._M_string_length = std::_V2::system_category();
    std::filesystem::weakly_canonical((path *)&buffer,(error_code *)fullPath);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&absPath._M_pathname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer);
    uVar15 = buffer._32_8_;
    _Var14 = absPath._M_cmpts;
    buffer._32_8_ = 0;
    absPath._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )uVar15;
    if (_Var14._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&absPath._M_cmpts,
                 (_Impl *)_Var14._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)&buffer);
    std::filesystem::__cxx11::path::~path((path *)&buffer);
    uVar17 = sortKey;
    if ((int)pathStr._M_dataplus._M_p != 0) {
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = false;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_error._M_value = (int)pathStr._M_dataplus._M_p;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)pathStr._M_string_length;
      goto LAB_0022cc1c;
    }
  }
  else {
    local_198 = sortKey;
    std::filesystem::__cxx11::path::operator=(&absPath,fullPath);
    uVar17 = local_198;
  }
  local_198 = uVar17;
  pathStr._M_dataplus._M_p = (pointer)&pathStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pathStr,absPath._M_pathname._M_dataplus._M_p,
             absPath._M_pathname._M_dataplus._M_p + absPath._M_pathname._M_string_length);
  lock._M_owns = false;
  local_188 = library;
  lock._M_device = &this->mutex;
  std::unique_lock<std::shared_mutex>::lock(&lock);
  lock._M_owns = true;
  arrays_ = &this->lookupCache;
  uVar17 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)arrays_,&pathStr);
  sVar13 = pathStr._M_string_length;
  uVar21 = uVar17 >> ((byte)(this->lookupCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.groups_;
  lVar22 = (uVar17 & 0xff) * 4;
  uVar9 = (&UNK_004b638c)[lVar22];
  uVar10 = (&UNK_004b638d)[lVar22];
  uVar11 = (&UNK_004b638e)[lVar22];
  uVar12 = (&UNK_004b638f)[lVar22];
  ppVar5 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.elements_;
  local_178 = (error_category *)pathStr._M_dataplus._M_p;
  uVar6 = (this->lookupCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
          .arrays.groups_size_mask;
  uVar23 = 0;
  local_180 = this;
  do {
    pgVar2 = pgVar4 + uVar21;
    auVar27[0] = -(pgVar2->m[0].n == uVar9);
    auVar27[1] = -(pgVar2->m[1].n == uVar10);
    auVar27[2] = -(pgVar2->m[2].n == uVar11);
    auVar27[3] = -(pgVar2->m[3].n == uVar12);
    auVar27[4] = -(pgVar2->m[4].n == uVar9);
    auVar27[5] = -(pgVar2->m[5].n == uVar10);
    auVar27[6] = -(pgVar2->m[6].n == uVar11);
    auVar27[7] = -(pgVar2->m[7].n == uVar12);
    auVar27[8] = -(pgVar2->m[8].n == uVar9);
    auVar27[9] = -(pgVar2->m[9].n == uVar10);
    auVar27[10] = -(pgVar2->m[10].n == uVar11);
    auVar27[0xb] = -(pgVar2->m[0xb].n == uVar12);
    auVar27[0xc] = -(pgVar2->m[0xc].n == uVar9);
    auVar27[0xd] = -(pgVar2->m[0xd].n == uVar10);
    auVar27[0xe] = -(pgVar2->m[0xe].n == uVar11);
    auVar27[0xf] = -(pgVar2->m[0xf].n == uVar12);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      uVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      bVar26 = sVar13 == ppVar5[uVar21 * 0xf + (ulong)uVar19].first._M_string_length;
      ppVar25 = ppVar5 + uVar21 * 0xf + (ulong)uVar19;
      local_190 = __return_storage_ptr__;
      if (bVar26 && sVar13 != 0) {
        iVar16 = bcmp(local_178,(ppVar25->first)._M_dataplus._M_p,sVar13);
        bVar26 = iVar16 == 0;
      }
      __return_storage_ptr__ = local_190;
      if (bVar26) goto LAB_0022cac2;
    }
    if ((pgVar4[uVar21].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    lVar22 = uVar21 + uVar23;
    uVar23 = uVar23 + 1;
    uVar21 = lVar22 + 1U & uVar6;
  } while (uVar23 <= uVar6);
  ppVar25 = (value_type_pointer)0x0;
LAB_0022cac2:
  if (ppVar25 == (value_type_pointer)0x0) {
    std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
    pcVar3 = buffer.super_SmallVectorBase<char>.firstElement;
    buffer.super_SmallVectorBase<char>.len = 0;
    buffer.super_SmallVectorBase<char>.cap = 0x28;
    buffer.super_SmallVectorBase<char>.data_ = pcVar3;
    eVar29 = OS::readFile(&absPath,&buffer);
    pSVar20 = local_180;
    local_178 = eVar29._M_cat;
    iVar16 = eVar29._M_value;
    if (iVar16 == 0) {
      cacheBuffer((SourceBuffer *)&lock,local_180,&absPath,&pathStr,includedFrom,local_188,local_198
                  ,&buffer);
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = true;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_len = (size_t)lock._M_device;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)CONCAT71(lock._9_7_,lock._M_owns);
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.library = local_f8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0 + 0x18) =
           uStack_f0;
    }
    else {
      lock_1._M_device = &local_180->mutex;
      lock_1._M_owns = false;
      local_190 = __return_storage_ptr__;
      std::unique_lock<std::shared_mutex>::lock(&lock_1);
      lock_1._M_owns = true;
      local_88.first = (void *)0x0;
      local_188 = (SourceLibrary *)CONCAT44(local_188._4_4_,iVar16);
      local_88.second._M_cat = local_178;
      local_88.second._M_value = iVar16;
      local_198 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                                *)arrays_,&pathStr);
      sVar13 = pathStr._M_string_length;
      __s1 = pathStr._M_dataplus;
      uVar23 = local_198 >>
               ((byte)(pSVar20->lookupCache).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                      .arrays.groups_size_index & 0x3f);
      pgVar4 = (pSVar20->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.groups_;
      lVar22 = (local_198 & 0xff) * 4;
      uVar9 = (&UNK_004b638c)[lVar22];
      uVar10 = (&UNK_004b638d)[lVar22];
      uVar11 = (&UNK_004b638e)[lVar22];
      uVar12 = (&UNK_004b638f)[lVar22];
      ppVar5 = (pSVar20->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.elements_;
      uVar18 = (uint)local_198;
      uVar6 = (pSVar20->lookupCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
              .arrays.groups_size_mask;
      uVar24 = 0;
      uVar21 = uVar23;
      do {
        pgVar2 = pgVar4 + uVar21;
        auVar28[0] = -(pgVar2->m[0].n == uVar9);
        auVar28[1] = -(pgVar2->m[1].n == uVar10);
        auVar28[2] = -(pgVar2->m[2].n == uVar11);
        auVar28[3] = -(pgVar2->m[3].n == uVar12);
        auVar28[4] = -(pgVar2->m[4].n == uVar9);
        auVar28[5] = -(pgVar2->m[5].n == uVar10);
        auVar28[6] = -(pgVar2->m[6].n == uVar11);
        auVar28[7] = -(pgVar2->m[7].n == uVar12);
        auVar28[8] = -(pgVar2->m[8].n == uVar9);
        auVar28[9] = -(pgVar2->m[9].n == uVar10);
        auVar28[10] = -(pgVar2->m[10].n == uVar11);
        auVar28[0xb] = -(pgVar2->m[0xb].n == uVar12);
        auVar28[0xc] = -(pgVar2->m[0xc].n == uVar9);
        auVar28[0xd] = -(pgVar2->m[0xd].n == uVar10);
        auVar28[0xe] = -(pgVar2->m[0xe].n == uVar11);
        auVar28[0xf] = -(pgVar2->m[0xf].n == uVar12);
        for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar19 != 0;
            uVar19 = uVar19 - 1 & uVar19) {
          uVar8 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          bVar26 = sVar13 == ppVar5[uVar21 * 0xf + (ulong)uVar8].first._M_string_length;
          ppVar25 = ppVar5 + uVar21 * 0xf + (ulong)uVar8;
          if (bVar26 && sVar13 != 0) {
            iVar16 = bcmp(__s1._M_p,(ppVar25->first)._M_dataplus._M_p,sVar13);
            bVar26 = iVar16 == 0;
          }
          pSVar20 = local_180;
          if (bVar26) goto LAB_0022ce31;
        }
        if ((pgVar4[uVar21].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar18 & 7]) == 0) break;
        lVar22 = uVar21 + uVar24;
        uVar24 = uVar24 + 1;
        uVar21 = lVar22 + 1U & uVar6;
      } while (uVar24 <= uVar6);
      ppVar25 = (value_type_pointer)0x0;
LAB_0022ce31:
      __return_storage_ptr__ = local_190;
      iVar16 = (int)local_188;
      if (ppVar25 == (value_type_pointer)0x0) {
        if ((pSVar20->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .size_ctrl.size <
            (pSVar20->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                    ((locator *)&lock,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                      *)arrays_,(arrays_type *)arrays_,uVar23,local_198,&local_199,&pathStr,
                     &local_88);
          psVar1 = &(pSVar20->lookupCache).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                    ((locator *)&lock,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                      *)arrays_,local_198,&local_199,&pathStr,&local_88);
        }
      }
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = false;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_error._M_value = iVar16;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)local_178;
      std::unique_lock<std::shared_mutex>::~unique_lock(&lock_1);
    }
    if (buffer.super_SmallVectorBase<char>.data_ != pcVar3) {
      operator_delete(buffer.super_SmallVectorBase<char>.data_);
    }
  }
  else {
    iVar16 = (ppVar25->second).second._M_value;
    if (iVar16 == 0) {
      createBufferEntry((SourceBuffer *)&buffer,local_180,
                        (ppVar25->second).first._M_t.
                        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl
                        ,includedFrom,local_188,local_198,in_stack_fffffffffffffe48);
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = true;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_len = (size_t)buffer.super_SmallVectorBase<char>.data_;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)buffer.super_SmallVectorBase<char>.len;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.library = (SourceLibrary *)buffer.super_SmallVectorBase<char>.cap;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0 + 0x18) =
           buffer.super_SmallVectorBase<char>._24_8_;
    }
    else {
      peVar7 = (ppVar25->second).second._M_cat;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = false;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_error._M_value = iVar16;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)peVar7;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pathStr._M_dataplus._M_p != &pathStr.field_2) {
    operator_delete(pathStr._M_dataplus._M_p,pathStr.field_2._M_allocated_capacity + 1);
  }
LAB_0022cc1c:
  std::filesystem::__cxx11::path::~path(&absPath);
  return __return_storage_ptr__;
}

Assistant:

SourceManager::BufferOrError SourceManager::openCached(const fs::path& fullPath,
                                                       SourceLocation includedFrom,
                                                       const SourceLibrary* library,
                                                       uint64_t sortKey) {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(fullPath, ec);
        if (ec)
            return nonstd::make_unexpected(ec);
    }
    else {
        absPath = fullPath;
    }

    // first see if we have this file cached
    std::string pathStr = getU8Str(absPath);
    {
        std::unique_lock<std::shared_mutex> lock(mutex);
        auto it = lookupCache.find(pathStr);
        if (it != lookupCache.end()) {
            auto& [fd, ec] = it->second;
            if (ec)
                return nonstd::make_unexpected(ec);

            SLANG_ASSERT(fd);
            return createBufferEntry(fd.get(), includedFrom, library, sortKey, lock);
        }
    }

    // do the read
    SmallVector<char> buffer;
    if (std::error_code ec = OS::readFile(absPath, buffer)) {
        std::unique_lock<std::shared_mutex> lock(mutex);
        lookupCache.emplace(pathStr, std::pair{nullptr, ec});
        return nonstd::make_unexpected(ec);
    }

    return cacheBuffer(std::move(absPath), std::move(pathStr), includedFrom, library, sortKey,
                       std::move(buffer));
}